

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

uint * qt_fetch_linear_gradient_template<GradientBase32,unsigned_int>
                 (uint *buffer,Operator *op,QSpanData *data,int y,int x,int length)

{
  bool bVar1;
  Spread SVar2;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int __x;
  QGradientData *in_RDI;
  int in_R8D;
  int in_R9D;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  qreal y_1;
  qreal x_1;
  qreal rw;
  int inc_fixed;
  int t_fixed;
  uint *end;
  qreal ry;
  qreal rx;
  bool affine;
  qreal inc;
  qreal t;
  uint *b;
  qreal in_stack_ffffffffffffff68;
  QGradientData *pQVar4;
  QGradientData *in_stack_ffffffffffffff70;
  double local_70;
  double local_40;
  QGradientData *local_8;
  QGradientData *pQVar3;
  
  bVar1 = true;
  if ((*(double *)(in_RSI + 0x90) != 0.0) || (NAN(*(double *)(in_RSI + 0x90)))) {
    local_40 = *(double *)(in_RSI + 0x80) * *(double *)(in_RDX + 0x38) +
               *(double *)(in_RSI + 0x88) * *(double *)(in_RDX + 0x40);
    bVar1 = false;
    if ((*(double *)(in_RDX + 0x48) == 0.0) && (!NAN(*(double *)(in_RDX + 0x48)))) {
      bVar1 = *(double *)(in_RDX + 0x60) == 0.0;
    }
    if (bVar1) {
      local_40 = local_40 * 1023.0;
    }
  }
  else {
    local_40 = 0.0;
  }
  pQVar4 = (QGradientData *)(&in_RDI->spread + in_R9D);
  local_8 = in_RDI;
  if (bVar1) {
    if ((local_40 <= -1e-05) || (1e-05 <= local_40)) {
      pQVar3 = in_RDI;
      std::abs((int)in_RDI);
      __x = (int)pQVar3;
      if ((4194303.0 <= extraout_XMM0_Qa_00) ||
         ((std::abs(__x), 4194303.0 <= extraout_XMM0_Qa_01 ||
          (std::abs(__x), 4194303.0 <= extraout_XMM0_Qa_02)))) {
        for (; local_8 < pQVar4; local_8 = (QGradientData *)&local_8->field_0x4) {
          SVar2 = GradientBase32::fetchSingle(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          local_8->spread = SVar2;
        }
      }
      else {
        for (; local_8 < pQVar4; local_8 = (QGradientData *)&local_8->field_0x4) {
          SVar2 = GradientBase32::fetchSingle
                            (in_stack_ffffffffffffff70,
                             (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
          local_8->spread = SVar2;
        }
      }
    }
    else {
      std::abs((int)in_RDI);
      if (4194303.0 <= extraout_XMM0_Qa) {
        pQVar4 = in_RDI;
        GradientBase32::fetchSingle(in_stack_ffffffffffffff70,(qreal)in_RDI);
        GradientBase32::memfill
                  (&in_stack_ffffffffffffff70->spread,(Type)((ulong)pQVar4 >> 0x20),(int)pQVar4);
      }
      else {
        pQVar4 = in_RDI;
        GradientBase32::fetchSingle(in_RDI,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
        GradientBase32::memfill
                  (&pQVar4->spread,(Type)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                   SUB84(in_stack_ffffffffffffff68,0));
      }
    }
  }
  else {
    local_70 = *(double *)(in_RDX + 0x60) * ((double)in_ECX + 0.5) +
               *(double *)(in_RDX + 0x48) * ((double)in_R8D + 0.5) + *(double *)(in_RDX + 0x68);
    for (; local_8 < pQVar4; local_8 = (QGradientData *)&local_8->field_0x4) {
      SVar2 = GradientBase32::fetchSingle(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_8->spread = SVar2;
      local_70 = *(double *)(in_RDX + 0x48) + local_70;
      if ((local_70 == 0.0) && (!NAN(local_70))) {
        local_70 = *(double *)(in_RDX + 0x48) + local_70;
      }
    }
  }
  return &in_RDI->spread;
}

Assistant:

static inline const BlendType * QT_FASTCALL qt_fetch_linear_gradient_template(
        BlendType *buffer, const Operator *op, const QSpanData *data,
        int y, int x, int length)
{
    const BlendType *b = buffer;
    qreal t, inc;

    bool affine = true;
    qreal rx=0, ry=0;
    if (op->linear.l == 0) {
        t = inc = 0;
    } else {
        rx = data->m21 * (y + qreal(0.5)) + data->m11 * (x + qreal(0.5)) + data->dx;
        ry = data->m22 * (y + qreal(0.5)) + data->m12 * (x + qreal(0.5)) + data->dy;
        t = op->linear.dx*rx + op->linear.dy*ry + op->linear.off;
        inc = op->linear.dx * data->m11 + op->linear.dy * data->m12;
        affine = !data->m13 && !data->m23;

        if (affine) {
            t *= (GRADIENT_STOPTABLE_SIZE - 1);
            inc *= (GRADIENT_STOPTABLE_SIZE - 1);
        }
    }

    const BlendType *end = buffer + length;
    if (affine) {
        if (inc > qreal(-1e-5) && inc < qreal(1e-5)) {
            if (std::abs(t) < FIXPT_MAX)
                GradientBase::memfill(buffer, GradientBase::fetchSingle(data->gradient, int(t * FIXPT_SIZE)), length);
            else
                GradientBase::memfill(buffer, GradientBase::fetchSingle(data->gradient, t / GRADIENT_STOPTABLE_SIZE), length);
        } else {
            if (std::abs(t) < FIXPT_MAX && std::abs(inc) < FIXPT_MAX && std::abs(t + inc * length) < FIXPT_MAX) {
                // we can use fixed point math
                int t_fixed = int(t * FIXPT_SIZE);
                int inc_fixed = int(inc * FIXPT_SIZE);
                while (buffer < end) {
                    *buffer = GradientBase::fetchSingle(data->gradient, t_fixed);
                    t_fixed += inc_fixed;
                    ++buffer;
                }
            } else {
                // we have to fall back to float math
                while (buffer < end) {
                    *buffer = GradientBase::fetchSingle(data->gradient, t/GRADIENT_STOPTABLE_SIZE);
                    t += inc;
                    ++buffer;
                }
            }
        }
    } else { // fall back to float math here as well
        qreal rw = data->m23 * (y + qreal(0.5)) + data->m13 * (x + qreal(0.5)) + data->m33;
        while (buffer < end) {
            qreal x = rx/rw;
            qreal y = ry/rw;
            t = (op->linear.dx*x + op->linear.dy *y) + op->linear.off;

            *buffer = GradientBase::fetchSingle(data->gradient, t);
            rx += data->m11;
            ry += data->m12;
            rw += data->m13;
            if (!rw) {
                rw += data->m13;
            }
            ++buffer;
        }
    }

    return b;
}